

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uresdata.cpp
# Opt level: O2

int32_t * res_getIntVector_63(ResourceData *pResData,Resource res,int32_t *pLength)

{
  anon_struct_8_2_41692a41 *paVar1;
  int32_t *piVar2;
  int32_t iVar3;
  
  if ((res & 0xf0000000) == 0xe0000000) {
    if ((res & 0xfffffff) == 0) {
      paVar1 = &gEmpty32;
    }
    else {
      paVar1 = (anon_struct_8_2_41692a41 *)((ulong)((res & 0xfffffff) << 2) + (long)pResData->pRoot)
      ;
    }
    iVar3 = paVar1->length;
    piVar2 = &paVar1->res;
  }
  else {
    piVar2 = (int32_t *)0x0;
    iVar3 = 0;
  }
  if (pLength != (int32_t *)0x0) {
    *pLength = iVar3;
  }
  return piVar2;
}

Assistant:

U_CAPI const int32_t * U_EXPORT2
res_getIntVector(const ResourceData *pResData, Resource res, int32_t *pLength) {
    const int32_t *p;
    uint32_t offset=RES_GET_OFFSET(res);
    int32_t length;
    if(RES_GET_TYPE(res)==URES_INT_VECTOR) {
        p= offset==0 ? (const int32_t *)&gEmpty32 : pResData->pRoot+offset;
        length=*p++;
    } else {
        p=NULL;
        length=0;
    }
    if(pLength) {
        *pLength=length;
    }
    return p;
}